

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_iarchive.h
# Opt level: O1

bool __thiscall serialization::xml_iarchive::load_key_start_optional(xml_iarchive *this,char *key)

{
  iterator *piVar1;
  _Elt_pointer ppxVar2;
  xml_node<char> *pxVar3;
  xml_node<char> *node;
  xml_node<char> *local_18;
  
  ppxVar2 = (this->stack_).c.
            super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppxVar2 ==
      (this->stack_).c.
      super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    ppxVar2 = (this->stack_).c.
              super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  pxVar3 = rapidxml::xml_node<char>::first_node(ppxVar2[-1],key,0,true);
  if (pxVar3 != (xml_node<char> *)0x0) {
    ppxVar2 = (this->stack_).c.
              super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppxVar2 ==
        (this->stack_).c.
        super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      local_18 = pxVar3;
      std::deque<rapidxml::xml_node<char>const*,std::allocator<rapidxml::xml_node<char>const*>>::
      _M_push_back_aux<rapidxml::xml_node<char>const*const&>
                ((deque<rapidxml::xml_node<char>const*,std::allocator<rapidxml::xml_node<char>const*>>
                  *)&this->stack_,&local_18);
    }
    else {
      *ppxVar2 = pxVar3;
      piVar1 = &(this->stack_).c.
                super__Deque_base<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>
                ._M_impl.super__Deque_impl_data._M_finish;
      piVar1->_M_cur = piVar1->_M_cur + 1;
    }
  }
  return pxVar3 != (xml_node<char> *)0x0;
}

Assistant:

bool load_key_start_optional(const char * key) const
    {
        serialization_trace trace(__func__, key);

        auto node = stack_.top()->first_node(key);
        if(node == nullptr)
        {
            return false;
        }
        stack_.push(node);
        return true;
    }